

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O1

bool P_HitFriend(AActor *self)

{
  bool bVar1;
  byte bVar2;
  AActor *extraout_RAX;
  double distance;
  DAngle angle;
  FTranslatedLineTarget t;
  undefined1 local_50 [16];
  PClass *local_40;
  FTranslatedLineTarget local_38;
  AActor *pAVar3;
  
  if ((((self->flags).Value & 0x8000000) != 0) &&
     (pAVar3 = (self->target).field_0.p, pAVar3 != (AActor *)0x0)) {
    if (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      pAVar3 = (self->target).field_0.p;
      if ((pAVar3 != (AActor *)0x0) &&
         (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        (self->target).field_0.p = (AActor *)0x0;
        pAVar3 = (AActor *)0x0;
      }
      AActor::AngleTo((AActor *)local_50,self,SUB81(pAVar3,0));
      pAVar3 = (self->target).field_0.p;
      if ((pAVar3 != (AActor *)0x0) &&
         (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        (self->target).field_0.p = (AActor *)0x0;
        pAVar3 = (AActor *)0x0;
      }
      distance = AActor::Distance2D(self,pAVar3,false);
      local_38.linetarget = (AActor *)local_50._0_8_;
      local_40 = (PClass *)0x0;
      P_AimLineAttack((AActor *)(local_50 + 8),(DAngle *)self,distance,&local_38,
                      &local_38.angleFromSource,(int)&local_40,(AActor *)0x1,(AActor *)0x0);
      bVar1 = true;
      pAVar3 = extraout_RAX;
      if ((AActor *)local_38.angleFromSource.Degrees != (AActor *)0x0) {
        pAVar3 = (self->target).field_0.p;
        if ((pAVar3 != (AActor *)0x0) &&
           (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
          (self->target).field_0.p = (AActor *)0x0;
          pAVar3 = (AActor *)0x0;
        }
        if ((AActor *)local_38.angleFromSource.Degrees != pAVar3) {
          bVar1 = AActor::IsFriend(self,(AActor *)local_38.angleFromSource.Degrees);
          pAVar3 = (AActor *)(ulong)bVar1;
          bVar1 = false;
        }
      }
      bVar2 = (byte)pAVar3;
      if (!bVar1) goto LAB_003ed4fd;
    }
    else {
      (self->target).field_0.p = (AActor *)0x0;
    }
  }
  bVar2 = 0;
LAB_003ed4fd:
  return (bool)(bVar2 & 1);
}

Assistant:

bool P_HitFriend(AActor * self)
{
	FTranslatedLineTarget t;

	if (self->flags&MF_FRIENDLY && self->target != NULL)
	{
		DAngle angle = self->AngleTo(self->target);
		double dist = self->Distance2D(self->target);
		P_AimLineAttack (self, angle, dist, &t, 0., true);
		if (t.linetarget != NULL && t.linetarget != self->target)
		{
			return self->IsFriend (t.linetarget);
		}
	}
	return false;
}